

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeDotLayer(NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  pointer pcVar1;
  LogMessage *pLVar2;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *__src;
  ShapeRange *pSVar3;
  ShapeRange *pSVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_02;
  ShapeConstraint outputShape;
  ShapeRange local_1f0;
  undefined1 local_1d0 [160];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  this_02 = &this->blobShapes;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_02,(key_type *)
                                 ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_1d0,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_02,*(key_type **)
                                  ((specLayer->input_).super_RepeatedPtrFieldBase.rep_ + 1));
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  __src = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
          ::operator[](this_02,(key_type *)
                               ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  memcpy(local_1d0,__src,0xa0);
  pcVar1 = (__src->_name)._M_dataplus._M_p;
  local_130._M_p = (pointer)&local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + (__src->_name)._M_string_length);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar2 = google::protobuf::internal::LogMessage::operator<<
                       (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1f0,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  ShapeConstraint::setName
            ((ShapeConstraint *)local_1d0,
             (string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar3 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_1d0);
  pSVar4 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect(&local_1f0,pSVar3,pSVar4);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)local_1d0,&local_1f0);
  pSVar3 = ShapeConstraint::batchRange((ShapeConstraint *)local_1d0);
  pSVar4 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect(&local_1f0,pSVar3,pSVar4);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)local_1d0,&local_1f0);
  pSVar3 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_1d0);
  pSVar4 = ShapeConstraint::sequenceRange(this_01);
  ShapeRange::intersect(&local_1f0,pSVar3,pSVar4);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)local_1d0,&local_1f0);
  pSVar3 = ShapeConstraint::batchRange((ShapeConstraint *)local_1d0);
  pSVar4 = ShapeConstraint::batchRange(this_01);
  ShapeRange::intersect(&local_1f0,pSVar3,pSVar4);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)local_1d0,&local_1f0);
  ShapeConstraint::setHeight(this_00,1);
  ShapeConstraint::setWidth(this_00,1);
  ShapeConstraint::setHeight(this_01,1);
  ShapeConstraint::setWidth(this_01,1);
  ShapeConstraint::copyFrom(this_00,this_01);
  ShapeConstraint::copyFrom(this_01,this_00);
  pSVar3 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_1d0);
  ShapeConstraint::updateSequenceRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::batchRange((ShapeConstraint *)local_1d0);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::sequenceRange((ShapeConstraint *)local_1d0);
  ShapeConstraint::updateSequenceRange(this_01,pSVar3);
  pSVar3 = ShapeConstraint::batchRange((ShapeConstraint *)local_1d0);
  ShapeConstraint::updateBatchRange(this_01,pSVar3);
  ShapeConstraint::setChannel((ShapeConstraint *)local_1d0,1);
  ShapeConstraint::setHeight((ShapeConstraint *)local_1d0,1);
  ShapeConstraint::setWidth((ShapeConstraint *)local_1d0,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_p != &local_120) {
    operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeDotLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape1 = blobShapes[specLayer.input(0)];
    ShapeConstraint& inputShape2 = blobShapes[specLayer.input(1)];
    ShapeConstraint outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));
#if COREML_VALIDATOR_VERBOSE
    std::cout << "Dot layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape1;
    std::cout << inputShape2;
    std::cout << "Dot layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape1.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape1.batchRange()));
    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape2.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape2.batchRange()));

    inputShape1.setHeight(1);
    inputShape1.setWidth(1);
    inputShape2.setHeight(1);
    inputShape2.setWidth(1);

    // The inputs need to be equal
    inputShape1.copyFrom(inputShape2);
    inputShape2.copyFrom(inputShape1);

    inputShape1.updateSequenceRange(outputShape.sequenceRange());
    inputShape1.updateBatchRange(outputShape.batchRange());

    inputShape2.updateSequenceRange(outputShape.sequenceRange());
    inputShape2.updateBatchRange(outputShape.batchRange());

    outputShape.setChannel(1);
    outputShape.setHeight(1);
    outputShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Dot layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape1;
    std::cout << inputShape2;
    std::cout << "Dot layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}